

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManTruthQuit(void)

{
  Vec_Mem_t *__ptr;
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  
  if (s_vTtMem == (Vec_Mem_t *)0x0) {
    return;
  }
  printf("TT = %d (%.2f %%)\n",((double)s_vTtMem->nEntries * 100.0) / (double)s_nCalls);
  __ptr = s_vTtMem;
  if (s_vTtMem == (Vec_Mem_t *)0x0) goto LAB_00771373;
  pVVar2 = s_vTtMem->vTable;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      __ptr->vTable->pArray = (int *)0x0;
      pVVar2 = __ptr->vTable;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00771337;
    }
    free(pVVar2);
    __ptr->vTable = (Vec_Int_t *)0x0;
  }
LAB_00771337:
  pVVar2 = __ptr->vNexts;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      __ptr->vNexts->pArray = (int *)0x0;
      pVVar2 = __ptr->vNexts;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00771373;
    }
    free(pVVar2);
    __ptr->vNexts = (Vec_Int_t *)0x0;
  }
LAB_00771373:
  iVar1 = __ptr->iPage;
  if (-1 < iVar1) {
    lVar3 = -1;
    do {
      if (__ptr->ppPages[lVar3 + 1] != (word *)0x0) {
        free(__ptr->ppPages[lVar3 + 1]);
        __ptr->ppPages[lVar3 + 1] = (word *)0x0;
        iVar1 = __ptr->iPage;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  if (__ptr->ppPages != (word **)0x0) {
    free(__ptr->ppPages);
  }
  free(__ptr);
  s_nCalls = 0;
  s_vTtMem = (Vec_Mem_t *)0x0;
  return;
}

Assistant:

void Mf_ManTruthQuit()
{
    if ( s_vTtMem == NULL )
        return;
    printf( "TT = %d (%.2f %%)\n", Vec_MemEntryNum(s_vTtMem), 100.0 * Vec_MemEntryNum(s_vTtMem) / s_nCalls );
    Vec_MemHashFree( s_vTtMem );
    Vec_MemFree( s_vTtMem );
    s_vTtMem = NULL;
    s_nCalls = 0;
}